

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O0

void If_ManImproveNodePrepare
               (If_Man_t *p,If_Obj_t *pObj,int nLimit,Vec_Ptr_t *vFront,Vec_Ptr_t *vFrontOld,
               Vec_Ptr_t *vVisited)

{
  If_Cut_t *pIVar1;
  bool bVar2;
  int local_4c;
  If_Obj_t *pIStack_48;
  int i;
  If_Obj_t *pLeaf;
  If_Cut_t *pCut;
  Vec_Ptr_t *vVisited_local;
  Vec_Ptr_t *vFrontOld_local;
  Vec_Ptr_t *vFront_local;
  int nLimit_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  Vec_PtrClear(vFront);
  Vec_PtrClear(vFrontOld);
  Vec_PtrClear(vVisited);
  pIVar1 = If_ObjCutBest(pObj);
  local_4c = 0;
  while( true ) {
    bVar2 = false;
    if (local_4c < (int)(*(uint *)&pIVar1->field_0x1c >> 0x18)) {
      pIStack_48 = If_ManObj(p,(int)(&pIVar1[1].Area)[local_4c]);
      bVar2 = pIStack_48 != (If_Obj_t *)0x0;
    }
    if (!bVar2) break;
    Vec_PtrPush(vFront,pIStack_48);
    Vec_PtrPush(vFrontOld,pIStack_48);
    Vec_PtrPush(vVisited,pIStack_48);
    *(uint *)pIStack_48 = *(uint *)pIStack_48 & 0xfffffeff | 0x100;
    local_4c = local_4c + 1;
  }
  If_ManImproveMark_rec(p,pObj,vVisited);
  return;
}

Assistant:

void If_ManImproveNodePrepare( If_Man_t * p, If_Obj_t * pObj, int nLimit, Vec_Ptr_t * vFront, Vec_Ptr_t * vFrontOld, Vec_Ptr_t * vVisited )
{
    If_Cut_t * pCut;
    If_Obj_t * pLeaf;
    int i;
    Vec_PtrClear( vFront );
    Vec_PtrClear( vFrontOld );
    Vec_PtrClear( vVisited );
    // expand the cut downwards from the given place
    pCut = If_ObjCutBest(pObj);
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        Vec_PtrPush( vFront, pLeaf );
        Vec_PtrPush( vFrontOld, pLeaf );
        Vec_PtrPush( vVisited, pLeaf );
        pLeaf->fMark = 1;
    }
    // mark the nodes in the cone
    If_ManImproveMark_rec( p, pObj, vVisited );
}